

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressSequences_default
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  BYTE *prefixStart_00;
  BYTE *virtualStart;
  seq_t sequence_00;
  ZSTD_seqSymbol *pZVar1;
  ZSTD_longOffset_e ZVar2;
  BYTE *code;
  ZSTD_seqSymbol ZVar3;
  uint uVar4;
  BIT_DStream_status BVar5;
  BYTE *litLimit;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t __n;
  ulong uVar9;
  bool local_471;
  undefined1 *local_468;
  uint local_444;
  int nbSeq_local;
  size_t seqSize_local;
  void *seqStart_local;
  size_t maxDstSize_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  size_t lastLLSize;
  U32 i_1;
  size_t oneSeqSize;
  seq_t sequence;
  BYTE *pBStack_3b0;
  U32 i;
  size_t error;
  seqState_t seqState;
  BYTE *dictEnd;
  BYTE *vBase;
  BYTE *prefixStart;
  BYTE *litEnd;
  BYTE *litPtr;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  size_t local_2c8;
  void *local_2c0;
  size_t local_2b8;
  void *local_2b0;
  ZSTD_DCtx *local_2a8;
  BYTE *local_2a0;
  ulong local_294;
  ZSTD_seqSymbol local_28c;
  ulong local_284;
  undefined4 local_27c;
  int kUseUpdateFseState;
  BYTE *matchBase;
  size_t pos;
  size_t temp;
  U32 ll0;
  U32 extraBits;
  size_t offset;
  BYTE totalBits;
  BYTE ofBits;
  BYTE mlBits;
  BYTE llBits;
  U32 ofBase;
  U32 mlBase;
  U32 llBase;
  ZSTD_seqSymbol ofDInfo;
  ZSTD_seqSymbol mlDInfo;
  ZSTD_seqSymbol llDInfo;
  size_t local_210;
  size_t length1;
  BYTE *local_1d0;
  BYTE *match;
  BYTE *iLitEnd;
  BYTE *oend_w;
  BYTE *oMatchEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *local_198;
  BYTE *local_190;
  BYTE *local_188;
  BYTE **local_180;
  BYTE *local_178;
  BYTE *local_170;
  BYTE *local_168;
  BYTE *local_160;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  long local_138;
  BYTE *local_130;
  BYTE *local_128;
  BYTE *local_120;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  ulong local_f8;
  BYTE *local_f0;
  BYTE *local_e8;
  BYTE *local_e0;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  size_t local_a0;
  size_t lowBits_2;
  BIT_DStream_t *pBStack_90;
  U32 nbBits_2;
  ZSTD_seqSymbol **local_88;
  undefined8 local_80;
  size_t local_78;
  size_t lowBits_1;
  BIT_DStream_t *pBStack_68;
  U32 nbBits_1;
  ZSTD_seqSymbol **local_60;
  ZSTD_seqSymbol local_58;
  size_t local_50;
  size_t lowBits;
  BIT_DStream_t *pBStack_40;
  U32 nbBits;
  char **local_38;
  undefined8 local_2c;
  int local_24;
  ZSTD_seqSymbol *pZStack_20;
  int sub2;
  BYTE **local_18;
  BYTE **local_10;
  
  ip._0_4_ = isLongOffset;
  ostart = (BYTE *)((long)seqStart + seqSize);
  op = (BYTE *)((long)dst + maxDstSize);
  litEnd = dctx->litPtr;
  litLimit = litEnd + dctx->litSize;
  prefixStart_00 = (BYTE *)dctx->prefixStart;
  virtualStart = (BYTE *)dctx->virtualStart;
  seqState.pos = (size_t)dctx->dictEnd;
  litPtr = (BYTE *)dst;
  oend = (BYTE *)dst;
  iend = (BYTE *)seqStart;
  ip._4_4_ = nbSeq;
  local_2c8 = seqSize;
  local_2c0 = seqStart;
  local_2b8 = maxDstSize;
  local_2b0 = dst;
  local_2a8 = dctx;
  if (nbSeq != 0) {
    pBStack_3b0 = (BYTE *)0x0;
    dctx->fseEntropy = 1;
    for (sequence.match._4_4_ = 0; sequence.match._4_4_ < 3;
        sequence.match._4_4_ = sequence.match._4_4_ + 1) {
      seqState.prevOffset[(ulong)sequence.match._4_4_ - 1] =
           (ulong)(dctx->entropy).rep[sequence.match._4_4_];
    }
    sVar6 = BIT_initDStream((BIT_DStream_t *)&error,seqStart,(long)ostart - (long)seqStart);
    uVar4 = ERR_isError(sVar6);
    if (uVar4 != 0) {
      return 0xffffffffffffffec;
    }
    ZSTD_initFseState((ZSTD_fseState *)&seqState.DStream.limitPtr,(BIT_DStream_t *)&error,
                      local_2a8->LLTptr);
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateLL.table,(BIT_DStream_t *)&error,
                      local_2a8->OFTptr);
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateOffb.table,(BIT_DStream_t *)&error,
                      local_2a8->MLTptr);
    do {
      ZVar2 = (ZSTD_longOffset_e)ip;
      sVar6 = seqState.prevOffset[0];
      uVar9 = *(ulong *)(seqState.stateLL.state + (long)seqState.DStream.limitPtr * 8);
      ofDInfo = *(ZSTD_seqSymbol *)(seqState.stateML.state + (long)seqState.stateOffb.table * 8);
      uVar7 = *(ulong *)(seqState.stateOffb.state + (long)seqState.stateLL.table * 8);
      mlDInfo.baseValue = (U32)(uVar9 >> 0x20);
      ofBase = mlDInfo.baseValue;
      _totalBits = ofDInfo.baseValue;
      llBase = (U32)(uVar7 >> 0x20);
      offset._4_4_ = llBase;
      mlDInfo.nbAdditionalBits = (BYTE)(uVar9 >> 0x10);
      offset._3_1_ = mlDInfo.nbAdditionalBits;
      offset._2_1_ = ofDInfo.nbAdditionalBits;
      mlBase._2_1_ = (byte)(uVar7 >> 0x10);
      offset._1_1_ = mlBase._2_1_;
      offset._0_1_ = mlDInfo.nbAdditionalBits + ofDInfo.nbAdditionalBits + mlBase._2_1_;
      _mlBase = uVar7;
      if (mlBase._2_1_ < 2) {
        temp._0_4_ = (uint)(mlDInfo.baseValue == 0);
        if (mlBase._2_1_ == 0) {
          if ((uint)temp != 0) {
            seqState.prevOffset[0] = (size_t)seqState.stateML.table;
            seqState.stateML.table = (ZSTD_seqSymbol *)sVar6;
          }
        }
        else {
          uVar4 = llBase + (uint)temp;
          sVar6 = BIT_readBitsFast((BIT_DStream_t *)&error,1);
          lVar8 = uVar4 + sVar6;
          if (lVar8 == 3) {
            local_468 = (undefined1 *)((long)&seqState.stateML.table[-1].baseValue + 3);
          }
          else {
            local_468 = (undefined1 *)seqState.prevOffset[lVar8 + -1];
          }
          pos = (size_t)(local_468 + ((local_468 != (undefined1 *)0x0 ^ 0xffU) & 1));
          if (lVar8 != 1) {
            seqState.prevOffset[1] = seqState.prevOffset[0];
          }
          seqState.prevOffset[0] = (size_t)seqState.stateML.table;
          seqState.stateML.table = (ZSTD_seqSymbol *)pos;
        }
      }
      else {
        if (0x1f < mlBase._2_1_) {
          __assert_fail("ofBits <= MaxOff",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6407,
                        "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e, const ZSTD_prefetch_e)"
                       );
        }
        uVar4 = MEM_32bits();
        if (((uVar4 == 0) || (ZVar2 == ZSTD_lo_isRegularOffset)) || (offset._1_1_ < 0x19)) {
          uVar7 = (ulong)offset._4_4_;
          sVar6 = BIT_readBitsFast((BIT_DStream_t *)&error,(uint)offset._1_1_);
          _ll0 = (ZSTD_seqSymbol *)(uVar7 + sVar6);
          uVar4 = MEM_32bits();
          if (uVar4 != 0) {
            BIT_reloadDStream((BIT_DStream_t *)&error);
          }
        }
        else {
          if ((uint)offset._1_1_ < 0x20U - (int)seqState.DStream.bitContainer) {
            local_444 = (uint)offset._1_1_;
          }
          else {
            local_444 = 0x20 - (int)seqState.DStream.bitContainer;
          }
          temp._4_4_ = offset._1_1_ - local_444;
          uVar7 = (ulong)offset._4_4_;
          sVar6 = BIT_readBitsFast((BIT_DStream_t *)&error,offset._1_1_ - temp._4_4_);
          _ll0 = (ZSTD_seqSymbol *)(uVar7 + (sVar6 << ((byte)temp._4_4_ & 0x3f)));
          BIT_reloadDStream((BIT_DStream_t *)&error);
          if (temp._4_4_ != 0) {
            sVar6 = BIT_readBitsFast((BIT_DStream_t *)&error,temp._4_4_);
            _ll0 = (ZSTD_seqSymbol *)((long)&_ll0->nextState + sVar6);
          }
          if (5 < temp._4_4_) {
            __assert_fail("extraBits <= LONG_OFFSETS_MAX_EXTRA_BITS_32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x640d,
                          "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e, const ZSTD_prefetch_e)"
                         );
          }
        }
        seqState.prevOffset[1] = seqState.prevOffset[0];
        seqState.prevOffset[0] = (size_t)seqState.stateML.table;
        seqState.stateML.table = _ll0;
      }
      pZVar1 = seqState.stateML.table;
      sequence.litLength = (size_t)_totalBits;
      _ll0 = seqState.stateML.table;
      if (offset._2_1_ != 0) {
        sVar6 = BIT_readBitsFast((BIT_DStream_t *)&error,(uint)offset._2_1_);
        sequence.litLength = sVar6 + sequence.litLength;
      }
      uVar4 = MEM_32bits();
      if ((uVar4 != 0) && (0x13 < (uint)offset._2_1_ + (uint)offset._3_1_)) {
        BIT_reloadDStream((BIT_DStream_t *)&error);
      }
      uVar4 = MEM_64bits();
      if ((uVar4 != 0) && (0x1e < (byte)offset)) {
        BIT_reloadDStream((BIT_DStream_t *)&error);
      }
      oneSeqSize = (size_t)ofBase;
      if (offset._3_1_ != 0) {
        sVar6 = BIT_readBitsFast((BIT_DStream_t *)&error,(uint)offset._3_1_);
        oneSeqSize = sVar6 + oneSeqSize;
      }
      uVar4 = MEM_32bits();
      if (uVar4 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)&error);
      }
      local_27c = 0;
      local_38 = &seqState.DStream.limitPtr;
      local_2c._3_1_ = (byte)(uVar9 >> 0x18);
      lowBits._4_4_ = (uint)local_2c._3_1_;
      local_284 = uVar9;
      pBStack_40 = (BIT_DStream_t *)&error;
      local_2c = uVar9;
      local_50 = BIT_readBits((BIT_DStream_t *)&error,lowBits._4_4_);
      *local_38 = (char *)((local_2c & 0xffff) + local_50);
      local_60 = &seqState.stateOffb.table;
      local_28c = ofDInfo;
      local_58 = ofDInfo;
      ZVar3 = local_58;
      local_58.nbBits = ofDInfo.nbBits;
      lowBits_1._4_4_ = (uint)local_58.nbBits;
      pBStack_68 = (BIT_DStream_t *)&error;
      local_58 = ZVar3;
      local_78 = BIT_readBits((BIT_DStream_t *)&error,lowBits_1._4_4_);
      *local_60 = (ZSTD_seqSymbol *)(((ulong)local_58 & 0xffff) + local_78);
      uVar4 = MEM_32bits();
      if (uVar4 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)&error);
      }
      local_88 = &seqState.stateLL.table;
      local_294 = _mlBase;
      local_80 = _mlBase;
      uVar9 = local_80;
      local_80._3_1_ = (byte)(_mlBase >> 0x18);
      lowBits_2._4_4_ = (uint)local_80._3_1_;
      pBStack_90 = (BIT_DStream_t *)&error;
      local_80 = uVar9;
      local_a0 = BIT_readBits((BIT_DStream_t *)&error,lowBits_2._4_4_);
      *local_88 = (ZSTD_seqSymbol *)((local_80 & 0xffff) + local_a0);
      local_210 = sequence.litLength;
      local_170 = litPtr;
      local_178 = op;
      local_180 = &litEnd;
      oLitEnd = (BYTE *)seqState.pos;
      sequenceLength = (size_t)(litPtr + oneSeqSize);
      oMatchEnd = (BYTE *)(oneSeqSize + sequence.litLength);
      oend_w = litPtr + (long)oMatchEnd;
      iLitEnd = op + -0x20;
      match = litEnd + oneSeqSize;
      local_1d0 = (BYTE *)(sequenceLength + -(long)pZVar1);
      local_198 = virtualStart;
      local_190 = prefixStart_00;
      local_188 = litLimit;
      if (oend_w <= sequenceLength) {
        __assert_fail("oLitEnd < oMatchEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6386,
                      "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      local_471 = litLimit < match || iLitEnd < oend_w;
      if (local_471) {
        sequence_00.matchLength = sequence.litLength;
        sequence_00.litLength = oneSeqSize;
        sequence_00.offset = (size_t)pZVar1;
        sequence_00.match = (BYTE *)sequence.offset;
        local_168 = (BYTE *)ZSTD_execSequenceEnd
                                      (litPtr,op,sequence_00,local_180,litLimit,prefixStart_00,
                                       virtualStart,(BYTE *)seqState.pos);
      }
      else {
        if (litLimit < match) {
          __assert_fail("iLitEnd <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x638b,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (iLitEnd < sequenceLength) {
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x638c,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (iLitEnd < oend_w) {
          __assert_fail("oMatchEnd <= oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x638d,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        ZSTD_copy16(litPtr,litEnd);
        if (0x10 < oneSeqSize) {
          oend_1 = local_170 + 0x10;
          op_1 = *local_180 + 0x10;
          local_b8 = oneSeqSize - 0x10;
          diff._4_4_ = 0;
          ip_1 = oend_1 + -(long)op_1;
          local_e0 = oend_1 + local_b8;
          local_b0 = op_1;
          local_a8 = oend_1;
          if ((long)ip_1 < 8 && -0x10 < (long)ip_1) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if ((long)ip_1 < 0x10 && -0x10 < (long)ip_1) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(oend_1,op_1);
          oend_1 = oend_1 + 0x10;
          op_1 = op_1 + 0x10;
          if (oend_1 < local_e0) {
            do {
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
            } while (oend_1 < local_e0);
          }
        }
        local_170 = (BYTE *)sequenceLength;
        *local_180 = match;
        if ((ZSTD_seqSymbol *)(sequenceLength - (long)local_190) < pZVar1) {
          if ((ZSTD_seqSymbol *)(sequenceLength - (long)local_198) < pZVar1) {
            local_168 = (BYTE *)0xffffffffffffffec;
          }
          else {
            local_1d0 = oLitEnd + ((long)local_1d0 - (long)local_190);
            if (oLitEnd < local_1d0 + sequence.litLength) {
              __n = (long)oLitEnd - (long)local_1d0;
              memmove((void *)sequenceLength,local_1d0,__n);
              local_170 = (BYTE *)(sequenceLength + __n);
              local_210 = sequence.litLength - __n;
              local_1d0 = local_190;
              goto LAB_00212041;
            }
            memmove((void *)sequenceLength,local_1d0,sequence.litLength);
            local_168 = oMatchEnd;
          }
        }
        else {
LAB_00212041:
          if (oend_w < local_170) {
            __assert_fail("op <= oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63ac,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (iLitEnd < oend_w) {
            __assert_fail("oMatchEnd <= oend_w",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63ad,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_1d0 < local_190) {
            __assert_fail("match >= prefixStart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63ae,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_210 == 0) {
            __assert_fail("sequence.matchLength >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63af,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (pZVar1 < (ZSTD_seqSymbol *)0x10) {
            if ((ZSTD_seqSymbol *)0xf < pZVar1) {
              __assert_fail("sequence.offset < WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x63bc,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            local_10 = &local_170;
            local_18 = &local_1d0;
            pZStack_20 = pZVar1;
            if (local_170 < local_1d0) {
              __assert_fail("*ip <= *op",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6301,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (pZVar1 < (ZSTD_seqSymbol *)0x8) {
              local_24 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                  ::dec64table + (long)pZVar1 * 4);
              *local_170 = *local_1d0;
              local_170[1] = local_1d0[1];
              local_170[2] = local_1d0[2];
              local_170[3] = local_1d0[3];
              local_1d0 = local_1d0 +
                          *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                    ::dec32table + (long)pZVar1 * 4);
              ZSTD_copy4(local_170 + 4,local_1d0);
              *local_18 = *local_18 + -(long)local_24;
            }
            else {
              ZSTD_copy8(local_170,local_1d0);
            }
            *local_18 = *local_18 + 8;
            *local_10 = *local_10 + 8;
            if ((long)*local_10 - (long)*local_18 < 8) {
              __assert_fail("*op - *ip >= 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6313,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (8 < local_210) {
              if (oend_w <= local_170) {
                __assert_fail("op < oMatchEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x63c3,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              local_138 = local_210 - 8;
              local_128 = local_170;
              local_130 = local_1d0;
              diff_2._4_4_ = 1;
              ip_3 = local_170 + -(long)local_1d0;
              op_3 = local_1d0;
              oend_3 = local_170;
              local_160 = local_170 + local_138;
              if ((long)ip_3 < 8) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if ((long)ip_3 < 0x10) {
                do {
                  ZSTD_copy8(oend_3,op_3);
                  oend_3 = oend_3 + 8;
                  op_3 = op_3 + 8;
                } while (oend_3 < local_160);
              }
              else {
                if ((long)ip_3 < 0x10 && -0x10 < (long)ip_3) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(local_170,local_1d0);
                oend_3 = oend_3 + 0x10;
                op_3 = op_3 + 0x10;
                if (oend_3 < local_160) {
                  do {
                    ZSTD_copy16(oend_3,op_3);
                    oend_3 = oend_3 + 0x10;
                    op_3 = op_3 + 0x10;
                    ZSTD_copy16(oend_3,op_3);
                    oend_3 = oend_3 + 0x10;
                    op_3 = op_3 + 0x10;
                  } while (oend_3 < local_160);
                }
              }
            }
            local_168 = oMatchEnd;
          }
          else {
            local_e8 = local_170;
            local_f0 = local_1d0;
            local_f8 = local_210;
            diff_1._4_4_ = 0;
            ip_2 = local_170 + -(long)local_1d0;
            op_2 = local_1d0;
            oend_2 = local_170;
            local_120 = local_170 + local_210;
            if ((long)ip_2 < 8 && -0x10 < (long)ip_2) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if ((long)ip_2 < 0x10 && -0x10 < (long)ip_2) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(local_170,local_1d0);
            oend_2 = oend_2 + 0x10;
            op_2 = op_2 + 0x10;
            if (oend_2 < local_120) {
              do {
                ZSTD_copy16(oend_2,op_2);
                oend_2 = oend_2 + 0x10;
                op_2 = op_2 + 0x10;
                ZSTD_copy16(oend_2,op_2);
                oend_2 = oend_2 + 0x10;
                op_2 = op_2 + 0x10;
              } while (oend_2 < local_120);
            }
            local_168 = oMatchEnd;
          }
        }
      }
      code = local_168;
      BIT_reloadDStream((BIT_DStream_t *)&error);
      uVar4 = ZSTD_isError((size_t)code);
      if (uVar4 == 0) {
        litPtr = code + (long)litPtr;
      }
      else {
        pBStack_3b0 = code;
      }
      ip._4_4_ = ip._4_4_ + -1;
    } while (ip._4_4_ != 0);
    uVar4 = ZSTD_isError((size_t)pBStack_3b0);
    if (uVar4 != 0) {
      return (size_t)pBStack_3b0;
    }
    if (ip._4_4_ != 0) {
      return 0xffffffffffffffec;
    }
    BVar5 = BIT_reloadDStream((BIT_DStream_t *)&error);
    if ((int)BVar5 < 2) {
      return 0xffffffffffffffec;
    }
    for (lastLLSize._4_4_ = 0; lastLLSize._4_4_ < 3; lastLLSize._4_4_ = lastLLSize._4_4_ + 1) {
      (local_2a8->entropy).rep[lastLLSize._4_4_] =
           (U32)seqState.prevOffset[(ulong)lastLLSize._4_4_ - 1];
    }
  }
  uVar9 = (long)litLimit - (long)litEnd;
  if ((ulong)((long)op - (long)litPtr) < uVar9) {
    local_2a0 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(litPtr,litEnd,uVar9);
    local_2a0 = litPtr + (uVar9 - (long)oend);
  }
  return (size_t)local_2a0;
}

Assistant:

static size_t
ZSTD_decompressSequences_default(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}